

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.c
# Opt level: O1

int base58_decode(char *base58,size_t base58_len,uchar *bytes_out,size_t *len)

{
  uint uVar1;
  undefined1 *dest;
  long lVar2;
  uint *puVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint *puVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint *puVar12;
  size_t sVar13;
  size_t __n;
  bool bVar14;
  uint32_t bn_buf [128];
  undefined1 local_238 [520];
  
  puVar3 = (uint *)0xfffffffe;
  if (base58_len == 0 || base58 == (char *)0x0) goto LAB_00163942;
  sVar13 = 0;
  do {
    __n = sVar13;
    if (base58[sVar13] != '1') break;
    sVar13 = sVar13 + 1;
    __n = base58_len;
  } while (base58_len != sVar13);
  lVar11 = base58_len - __n;
  if (lVar11 == 0) {
    if ((bytes_out != (uchar *)0x0) && (__n <= *len)) {
      memset(bytes_out,0,__n);
    }
    *len = __n;
    puVar3 = (uint *)0x0;
    goto LAB_00163942;
  }
  uVar9 = lVar11 * 6 + 7;
  uVar5 = (uVar9 >> 3) + 3;
  if (uVar9 < 0x1008) {
    dest = local_238;
LAB_0016376d:
    uVar9 = uVar5 >> 2;
    puVar3 = (uint *)(dest + uVar9 * 4);
    puVar12 = (uint *)(dest + uVar9 * 4 + -4);
    *puVar12 = 0;
    puVar8 = puVar12;
    if (base58_len != __n) {
      lVar2 = -4;
      lVar10 = 0;
      do {
        if (""[(byte)base58[lVar10 + __n]] == '\0') {
          iVar4 = 5;
        }
        else {
          iVar4 = 0;
          if (lVar2 < -3) {
            uVar7 = (ulong)(byte)(""[(byte)base58[lVar10 + __n]] - 1);
            puVar8 = puVar12;
            do {
              uVar6 = uVar7 + (ulong)*puVar8 * 0x3a;
              *puVar8 = (uint)uVar6;
              uVar7 = uVar6 >> 0x20;
              bVar14 = puVar8 != (uint *)(lVar2 + (long)puVar3);
              if (!bVar14 && uVar7 != 0) {
                *(int *)((long)puVar3 + lVar2 + -4) = (int)(uVar6 >> 0x20);
                lVar2 = lVar2 + -4;
              }
              puVar8 = puVar8 + -1;
            } while ((bVar14 || uVar7 == 0) && (uint *)(lVar2 + (long)puVar3) <= puVar8);
          }
        }
        if (iVar4 != 0) {
          if (iVar4 != 5) goto LAB_00163942;
          puVar3 = (uint *)0xfffffffe;
          goto LAB_00163911;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != lVar11);
      puVar12 = (uint *)(lVar2 + (long)puVar3);
      puVar8 = puVar12;
    }
    for (; puVar12 < puVar3; puVar12 = puVar12 + 1) {
      uVar1 = *puVar12;
      *puVar12 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    }
    lVar11 = 0;
    do {
      lVar2 = lVar11;
      lVar11 = lVar2 + 1;
    } while (*(char *)((long)puVar8 + lVar2) == '\0');
    if ((bytes_out != (uchar *)0x0) &&
       (dest + (((uVar9 * 4 + __n) - (long)puVar8) - lVar11) + 1 <= (undefined1 *)*len)) {
      memset(bytes_out,0,__n);
      memcpy(bytes_out + __n,(void *)((long)puVar8 + lVar2),
             (long)puVar3 + (-lVar11 - (long)puVar8) + 1);
    }
    *len = (size_t)(dest + (((uVar9 * 4 + __n) - (long)puVar8) - lVar11) + 1);
    puVar3 = (uint *)0x0;
  }
  else {
    dest = (undefined1 *)wally_malloc(uVar5 & 0x3ffffffffffffffc);
    if (dest != (undefined1 *)0x0) goto LAB_0016376d;
    puVar3 = (uint *)0xfffffffd;
    dest = (undefined1 *)0x0;
  }
LAB_00163911:
  if ((dest != (undefined1 *)0x0) &&
     (wally_clear(dest,uVar5 & 0x3ffffffffffffffc), dest != local_238)) {
    wally_free(dest);
  }
LAB_00163942:
  return (int)puVar3;
}

Assistant:

static int base58_decode(const char *base58, size_t base58_len,
                         unsigned char *bytes_out, size_t *len)
{
    uint32_t bn_buf[BIGNUM_WORDS];
    uint32_t *bn = bn_buf, *top_word, *bn_p;
    size_t bn_words = 0, ones, cp_len, i;
    unsigned char *cp;
    int ret = WALLY_EINVAL;

    if (!base58 || !base58_len)
        return WALLY_EINVAL; /* Empty string can't be decoded or represented */

    /* Process leading '1's */
    for (ones = 0; ones < base58_len && base58[ones] == '1'; ++ones)
        ; /* no-op*/

    if (!(base58_len -= ones)) {
        if (bytes_out && ones <= *len)
            memset(bytes_out, 0, ones);
        *len = ones;
        return WALLY_OK; /* String of all '1's */
    }
    base58 += ones; /* Skip over leading '1's */

    /* Take 6 bits to store each 58 bit number, rounded up to the next byte,
     * then round that up to a uint32_t word boundary. */
    bn_words = ((base58_len * 6 + 7) / 8 + 3) / 4;

    /* Allocate our bignum buffer if it won't fit on the stack */
    if (bn_words > BIGNUM_WORDS)
        if (!(bn = wally_malloc(bn_words * sizeof(*bn)))) {
            ret = WALLY_ENOMEM;
            goto cleanup;
        }

    /* Iterate through the characters adding them to our bignum. We keep
     * track of the current top word to avoid iterating over words that
     * we know are zero. */
    top_word = bn + bn_words - 1;
    *top_word = 0;

    for (i = 0; i < base58_len; ++i) {
        unsigned char byte = base58_to_byte[((unsigned char *)base58)[i]];
        if (!byte--)
            goto cleanup; /* Invalid char */

        for (bn_p = bn + bn_words - 1; bn_p >= top_word; --bn_p) {
            uint64_t mult = *bn_p * 58ull + byte;
            *bn_p = mult & 0xffffffff;
            byte = (mult >> 32) & 0xff;
            if (byte && bn_p == top_word) {
                *--top_word = byte; /* Increase bignum size */
                break;
            }
        }
    }

    /* We have our bignum stored from top_word to bn + bn_words - 1. Convert
     * its words to big-endian so we can simply memcpy it to bytes_out. */
    for (bn_p = top_word; bn_p < bn + bn_words; ++bn_p)
        *bn_p = cpu_to_be32(*bn_p); /* No-op on big-endian machines */

    for (cp = (unsigned char *)top_word; !*cp; ++cp)
        ; /* Skip leading zero bytes in our bignum */

    /* Copy the result if it fits, cleanup and return */
    cp_len = (unsigned char *)(bn + bn_words) - cp;

    if (bytes_out && ones + cp_len <= *len) {
        memset(bytes_out, 0, ones);
        memcpy(bytes_out + ones, cp, cp_len);
    }

    *len = ones + cp_len;
    ret = WALLY_OK;

cleanup:
    if (bn) {
        wally_clear(bn, bn_words * sizeof(*bn));
        if (bn != bn_buf)
            wally_free(bn);
    }
    return ret;
}